

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

void __thiscall CJSON::ParseObject(CJSON *this,string *obj)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  undefined8 *puVar7;
  CJSONException *pCVar8;
  long *plVar9;
  uint uVar10;
  size_type *psVar11;
  int iVar12;
  undefined4 uVar13;
  char cVar14;
  string Ret;
  char *beg;
  char *end;
  string Key;
  string Value;
  string local_c0;
  byte *local_a0;
  byte *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  key_type local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_a0 = (byte *)(obj->_M_dataplus)._M_p;
  local_98 = local_a0 + obj->_M_string_length;
  if (obj->_M_string_length != 0) {
    bVar2 = false;
    bVar3 = false;
    bVar4 = false;
    do {
      bVar1 = *local_a0;
      uVar10 = (uint)bVar1;
      if (uVar10 < 0x22) {
        if (((uVar10 - 9 < 2) || (uVar10 - 0xc < 2)) || (uVar10 == 0x20)) goto LAB_00129c39;
LAB_00129d8b:
        if (!bVar2) goto LAB_00129f02;
        if (local_70._M_string_length == 0) {
LAB_00129f09:
          uVar13 = 10;
          goto LAB_00129f0e;
        }
        if (!bVar4) {
          pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
          std::operator+(&local_90,"Missing seperator after \'",&local_70);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_c0._M_dataplus._M_p = (pointer)*plVar9;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_c0._M_dataplus._M_p == psVar11) {
            local_c0.field_2._M_allocated_capacity = *psVar11;
            local_c0.field_2._8_8_ = plVar9[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *psVar11;
          }
          local_c0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          CJSONException::CJSONException(pCVar8,&local_c0,MISSING_SEPERATOR);
          __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        if (bVar1 == 0x74) {
LAB_00129dbf:
          ParseBool_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
        }
        else if (bVar1 == 0x6e) {
          ParseNull_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
        }
        else {
          if (bVar1 == 0x66) goto LAB_00129dbf;
          iVar5 = isalnum((int)(char)bVar1);
          if (((iVar5 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x2b)) {
            pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
            std::operator+(&local_90,"Invalid type for key \'",&local_70);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_c0._M_dataplus._M_p = (pointer)*plVar9;
            psVar11 = (size_type *)(plVar9 + 2);
            if ((size_type *)local_c0._M_dataplus._M_p == psVar11) {
              local_c0.field_2._M_allocated_capacity = *psVar11;
              local_c0.field_2._8_8_ = plVar9[3];
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            }
            else {
              local_c0.field_2._M_allocated_capacity = *psVar11;
            }
            local_c0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            CJSONException::CJSONException(pCVar8,&local_c0,INVALID_TYPE);
            __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          ParseNum_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
        }
LAB_00129e21:
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
LAB_00129e4d:
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->m_Values,&local_70);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        bVar4 = false;
        local_70._M_string_length = 0;
        *local_70._M_dataplus._M_p = '\0';
        local_48 = 0;
        *local_50 = 0;
      }
      else {
        if (0x5a < uVar10) {
          if ((uVar10 == 0x5b) || (uVar10 == 0x7b)) {
            if (!bVar2) {
              bVar2 = true;
              goto LAB_00129c39;
            }
            if (local_70._M_string_length != 0) {
              if (!bVar4) {
                pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
                std::operator+(&local_90,"Missing seperator after \'",&local_70);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
                local_c0._M_dataplus._M_p = (pointer)*plVar9;
                psVar11 = (size_type *)(plVar9 + 2);
                if ((size_type *)local_c0._M_dataplus._M_p == psVar11) {
                  local_c0.field_2._M_allocated_capacity = *psVar11;
                  local_c0.field_2._8_8_ = plVar9[3];
                  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                }
                else {
                  local_c0.field_2._M_allocated_capacity = *psVar11;
                }
                local_c0._M_string_length = plVar9[1];
                *plVar9 = (long)psVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                CJSONException::CJSONException(pCVar8,&local_c0,MISSING_SEPERATOR);
                __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
              }
              bVar3 = true;
              cVar14 = (char)&local_c0;
              if (uVar10 == 0x5b) {
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                local_c0._M_string_length = 0;
                local_c0.field_2._M_allocated_capacity =
                     (ulong)(uint7)local_c0.field_2._M_allocated_capacity._1_7_ << 8;
                iVar5 = 0;
                do {
                  std::__cxx11::string::push_back(cVar14);
                  iVar12 = -(uint)(*local_a0 == 0x5d);
                  if (*local_a0 == 0x5b) {
                    iVar12 = 1;
                  }
                  iVar5 = iVar5 + iVar12;
                } while ((iVar5 != 0) && (local_a0 = local_a0 + 1, local_a0 != local_98));
              }
              else {
                if (uVar10 != 0x7b) goto LAB_00129e4d;
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                local_c0._M_string_length = 0;
                local_c0.field_2._M_allocated_capacity =
                     (ulong)(uint7)local_c0.field_2._M_allocated_capacity._1_7_ << 8;
                iVar5 = 0;
                do {
                  std::__cxx11::string::push_back(cVar14);
                  iVar12 = -(uint)(*local_a0 == 0x7d);
                  if (*local_a0 == 0x7b) {
                    iVar12 = 1;
                  }
                  iVar5 = iVar5 + iVar12;
                } while ((iVar5 != 0) && (local_a0 = local_a0 + 1, local_a0 != local_98));
              }
              std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_00129e4d;
            }
            goto LAB_00129f09;
          }
          if (uVar10 != 0x7d) goto LAB_00129d8b;
          break;
        }
        if (uVar10 == 0x22) {
          if (bVar2) {
            if (bVar3) {
              pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,"Missing seperator \',\'.","");
              CJSONException::CJSONException(pCVar8,&local_c0,MISSING_SEPERATOR);
              __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
            }
            if (local_70._M_string_length == 0) {
              ParseString_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
              std::__cxx11::string::operator=((string *)&local_70,(string *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_00129c39;
            }
            if ((local_48 != 0) || (!bVar4)) {
              pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
              std::operator+(&local_90,"Missing seperator after \'",&local_70);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
              local_c0._M_dataplus._M_p = (pointer)*plVar9;
              psVar11 = (size_type *)(plVar9 + 2);
              if ((size_type *)local_c0._M_dataplus._M_p == psVar11) {
                local_c0.field_2._M_allocated_capacity = *psVar11;
                local_c0.field_2._8_8_ = plVar9[3];
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar11;
              }
              local_c0._M_string_length = plVar9[1];
              *plVar9 = (long)psVar11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              CJSONException::CJSONException(pCVar8,&local_c0,MISSING_SEPERATOR);
              __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
            }
            ParseString_abi_cxx11_(&local_c0,this,(char **)&local_a0,(char **)&local_98);
            goto LAB_00129e21;
          }
          goto LAB_00129f02;
        }
        if (uVar10 == 0x2c) {
          if (!bVar2) goto LAB_00129f02;
          if (!bVar3) {
            pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Lonly \',\'","");
            CJSONException::CJSONException(pCVar8,&local_c0,WRONG_PLACED_SEPERATOR);
            __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          bVar3 = false;
        }
        else {
          if (uVar10 != 0x3a) goto LAB_00129d8b;
          if (!bVar2) goto LAB_00129f02;
          bVar4 = true;
          if (local_70._M_string_length == 0) goto LAB_00129f09;
LAB_00129c39:
          if (bVar3) goto LAB_00129e4d;
        }
      }
      if (local_a0 != local_98) {
        local_a0 = local_a0 + 1;
      }
    } while (local_a0 != local_98);
    if ((bVar2) && (*local_a0 != 0x7d)) {
LAB_00129f02:
      uVar13 = 2;
LAB_00129f0e:
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      *puVar7 = &PTR__CJSONException_00141d38;
      puVar7[1] = puVar7 + 3;
      puVar7[2] = 0;
      *(undefined1 *)(puVar7 + 3) = 0;
      *(undefined4 *)(puVar7 + 5) = uVar13;
      __cxa_throw(puVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline void ParseObject(const std::string &obj)
        {
            m_Values.clear();
            std::string Key, Value;
            bool ValAllowed = false;
            bool KeyValueValid = false;
            bool ValidObject = false;

            /*
                Why we use raw pointers instead of iterators or an for loop?
                Because I think its much faster to use pointer arithmetic instead
                of iterator arithmetic or for loops.

                If I'm wrong with my thoughts, please correct me.
             */
            const char *beg = obj.c_str();
            const char *end = beg + obj.size();

            while (beg != end && *beg != '}')
            {
                switch (*beg)
                {
                    // Parses a string.
                    case '\"':
                    {
                        // Throw an exception if we found a string outside of an object.
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
                        else if(KeyValueValid)
                            throw CJSONException("Missing seperator ','.", JSONErrorType::MISSING_SEPERATOR);

                        // Quick and dirty check if we need a key or a value.
                        if(Key.empty())
                            Key = ParseString(beg, end);
                        else if(Value.empty() && ValAllowed)
                        {
                            ValAllowed = false;
                            KeyValueValid = true;
                            Value = ParseString(beg, end);
                        }
                        else   // Throw an exception if we doesn't expected a key or value. That occurs always if a colon is missing.
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);                            
                    }break;

                    // Ignore all whitespace characters, which are outside of values.
                    case '\t':
                    case '\n':
                    case '\f':
                    case '\r':
                    case ' ':
                    {

                    }break;

                    // Parses an object or array.
                    case '{':
                    case '[':
                    {
                        // If this is the root object then set the validator flag.
                        if(!ValidObject)
                        {
                            ValidObject = true;
                            break;
                        }

                        // Throws an exception either if the key is missing or a value wasn't expected.
                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        // Objects and arrays are saved as strings and parsed later.
                        if(*beg == '{')
                            Value = ParseBracketStr('{', '}', beg, end);
                        else if(*beg == '[')
                            Value = ParseBracketStr('[', ']', beg, end);
                    }break;

                    // Allows the next key value pair.
                    case ',': 
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(!KeyValueValid)
                            throw CJSONException("Lonly ','", JSONErrorType::WRONG_PLACED_SEPERATOR);        

                        KeyValueValid = false;
                    }break;

                    // Allows a value.
                    case ':':
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY);

                        ValAllowed = true;
                    }break;

                    default:
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        switch (*beg)
                        {
                            // If a non escaped string begins with t or f it's maybe a boolean.
                            case 't':
                            case 'f':
                            {
                                Value = ParseBool(beg, end);
                            }break;

                            // If a non escaped string begins with n it's maybe a null object.
                            case 'n':
                            {
                                Value = ParseNull(beg, end);
                            }break;

                            default:
                            {
                                // If a non escaped string begins with a number, plus or minus it's maybe a number.
                                if(isalnum(*beg) || *beg == '-' || *beg == '+')
                                    Value = ParseNum(beg, end);
                                else    // Otherwise throw an exception.
                                    throw CJSONException("Invalid type for key '" + Key + "'", JSONErrorType::INVALID_TYPE);
                            }break;
                        }
                    }break;
                }

                // If key and value is set save it for later use.
                if(KeyValueValid)
                {
                    ValAllowed = false;
                    m_Values[Key] = Value;
                    Key.clear();
                    Value.clear();
                }

                if(beg != end)
                    beg++;
            }

            // Validates the object.
            if(ValidObject && *beg != '}')
                throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
        }